

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3362:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3362:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *pEVar1;
  Own<kj::NetworkAddress> *in_00;
  Promise<kj::Own<kj::AsyncIoStream>_> local_600;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> local_5f0;
  Own<kj::NetworkAddress> *local_478;
  Own<kj::NetworkAddress> *depValue;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> local_318;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<kj::Own<kj::NetworkAddress>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3362:13),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.ptr = (NetworkAddress *)output;
  ExceptionOr<kj::Own<kj::NetworkAddress>_>::ExceptionOr
            ((ExceptionOr<kj::Own<kj::NetworkAddress>_> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_478 = readMaybe<kj::NetworkAddress>
                          ((Maybe<kj::Own<kj::NetworkAddress>_> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_478 != (Own<kj::NetworkAddress> *)0x0) {
      in_00 = mv<kj::Own<kj::NetworkAddress>>(local_478);
      MaybeVoidCaller<kj::Own<kj::NetworkAddress>,kj::Promise<kj::Own<kj::AsyncIoStream>>>::
      apply<kj::(anonymous_namespace)::TestCase3358::run()::__0>
                ((MaybeVoidCaller<kj::Own<kj::NetworkAddress>,kj::Promise<kj::Own<kj::AsyncIoStream>>>
                  *)&local_600,(Type *)&this->field_0x20,in_00);
      handle(&local_5f0,this,&local_600);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::AsyncIoStream>>>
                         ((ExceptionOrValue *)depResult.value.ptr.ptr);
      ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::operator=(pEVar1,&local_5f0);
      ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr(&local_5f0);
      Promise<kj::Own<kj::AsyncIoStream>_>::~Promise(&local_600);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x21,in)
    ;
    handle(&local_318,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::AsyncIoStream>>>
                       ((ExceptionOrValue *)depResult.value.ptr.ptr);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::operator=(pEVar1,&local_318);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr(&local_318);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::Own<kj::NetworkAddress>_>::~ExceptionOr
            ((ExceptionOr<kj::Own<kj::NetworkAddress>_> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }